

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzeqnarray.cpp
# Opt level: O1

void __thiscall
TPZEqnArray<std::complex<double>_>::EqnForward
          (TPZEqnArray<std::complex<double>_> *this,TPZFMatrix<std::complex<double>_> *F,
          DecomposeType dec)

{
  double dVar1;
  uint uVar2;
  complex<double> *pcVar3;
  undefined8 uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  ostream *poVar7;
  long *plVar8;
  int iVar9;
  long lVar10;
  complex<double> *pcVar11;
  undefined8 *puVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  undefined8 uVar17;
  complex<double> udiag;
  double local_68;
  double dStack_60;
  double local_58;
  double dStack_50;
  long local_40;
  ulong local_38;
  
  if (this->fSymmetric == EIsSymmetric) {
    if (0 < this->fNumEq) {
      uVar15 = 0;
      do {
        uVar2 = (this->fEqStart).super_TPZManVector<int,_100>.super_TPZVec<int>.fStore[uVar15];
        lVar16 = (long)(int)uVar2;
        pcVar11 = (this->fEqValues).super_TPZManVector<std::complex<double>,_1000>.
                  super_TPZVec<std::complex<double>_>.fStore;
        lVar10 = lVar16 * 0x10;
        dVar1 = *(double *)pcVar11[lVar16]._M_value;
        if ((((dVar1 == 0.0) && (!NAN(dVar1))) &&
            (dVar1 = *(double *)(pcVar11[lVar16]._M_value + 8), dVar1 == 0.0)) && (!NAN(dVar1))) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Diagonal Value = 0 >> Aborting on Index = ",0x2a);
          poVar7 = (ostream *)std::ostream::operator<<(&std::cout,uVar2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," Equation = ",0xc);
          plVar8 = (long *)std::ostream::operator<<(poVar7,(int)uVar15);
          std::ios::widen((char)*(undefined8 *)(*plVar8 + -0x18) + (char)plVar8);
          std::ostream::put((char)plVar8);
          std::ostream::flush();
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Frontal/tpzeqnarray.cpp"
                     ,0x8b);
        }
        if (uVar15 == this->fNumEq - 1) {
          iVar9 = (int)(this->fEqValues).super_TPZManVector<std::complex<double>,_1000>.
                       super_TPZVec<std::complex<double>_>.fNElements;
        }
        else {
          iVar9 = (this->fEqStart).super_TPZManVector<int,_100>.super_TPZVec<int>.fStore[uVar15 + 1]
          ;
        }
        local_38 = uVar15;
        if ((dec & ~ELUPivot) == ELU) {
          pcVar11 = (this->fEqValues).super_TPZManVector<std::complex<double>,_1000>.
                    super_TPZVec<std::complex<double>_>.fStore + lVar16;
          lVar13 = (long)(this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.fStore
                         [lVar16];
          if (((lVar13 < 0) ||
              ((F->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow <= lVar13)) ||
             ((F->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<std::complex<double>_>::Error
                      ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          pcVar3 = F->fElem;
          uVar17 = *(undefined8 *)(pcVar3[lVar13]._M_value + 8);
          uVar4 = __divdc3((int)*(undefined8 *)pcVar3[lVar13]._M_value,uVar17,
                           *(undefined8 *)pcVar11->_M_value,*(undefined8 *)(pcVar11->_M_value + 8));
          *(undefined8 *)pcVar3[lVar13]._M_value = uVar4;
          *(undefined8 *)(pcVar3[lVar13]._M_value + 8) = uVar17;
        }
        lVar13 = (long)(this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.fStore[lVar16]
        ;
        local_40 = lVar10;
        if (((lVar13 < 0) ||
            ((F->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow <= lVar13)) ||
           ((F->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol < 1)) {
          TPZFMatrix<std::complex<double>_>::Error
                    ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        local_58 = *(double *)F->fElem[lVar13]._M_value;
        dStack_50 = *(double *)(F->fElem[lVar13]._M_value + 8);
        lVar10 = lVar16 + 1;
        if ((int)lVar10 < iVar9) {
          lVar13 = lVar10 * 0x10;
          iVar9 = ~uVar2 + iVar9;
          do {
            local_68 = local_58;
            dStack_60 = dStack_50;
            std::complex<double>::operator*=
                      ((complex<double> *)&local_68,
                       (complex<double> *)
                       (((this->fEqValues).super_TPZManVector<std::complex<double>,_1000>.
                         super_TPZVec<std::complex<double>_>.fStore)->_M_value + lVar13));
            lVar14 = (long)(this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.fStore
                           [lVar10];
            if (((lVar14 < 0) ||
                ((F->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow <= lVar14)) ||
               ((F->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol < 1)) {
              TPZFMatrix<std::complex<double>_>::Error
                        ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            pcVar11 = F->fElem + lVar14;
            dVar1 = *(double *)(pcVar11->_M_value + 8) - dStack_60;
            auVar6._8_4_ = SUB84(dVar1,0);
            auVar6._0_8_ = *(double *)pcVar11->_M_value - local_68;
            auVar6._12_4_ = (int)((ulong)dVar1 >> 0x20);
            *(undefined1 (*) [16])F->fElem[lVar14]._M_value = auVar6;
            lVar10 = lVar10 + 1;
            lVar13 = lVar13 + 0x10;
            iVar9 = iVar9 + -1;
          } while (iVar9 != 0);
        }
        uVar15 = local_38;
        if (dec == ELDLt) {
          puVar12 = (undefined8 *)
                    (((this->fEqValues).super_TPZManVector<std::complex<double>,_1000>.
                      super_TPZVec<std::complex<double>_>.fStore)->_M_value + local_40);
          lVar10 = (long)(this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.fStore
                         [lVar16];
          if (((lVar10 < 0) ||
              ((F->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow <= lVar10)) ||
             ((F->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<std::complex<double>_>::Error
                      ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          pcVar11 = F->fElem;
          uVar17 = *(undefined8 *)(pcVar11[lVar10]._M_value + 8);
          uVar4 = __divdc3((int)*(undefined8 *)pcVar11[lVar10]._M_value,uVar17,*puVar12,puVar12[1]);
          *(undefined8 *)pcVar11[lVar10]._M_value = uVar4;
          *(undefined8 *)(pcVar11[lVar10]._M_value + 8) = uVar17;
        }
        uVar15 = uVar15 + 1;
      } while ((long)uVar15 < (long)this->fNumEq);
    }
  }
  else if ((this->fSymmetric == EIsNonSymmetric) && (1 < this->fNumEq)) {
    uVar15 = 1;
    do {
      uVar2 = (this->fEqStart).super_TPZManVector<int,_100>.super_TPZVec<int>.fStore[uVar15];
      lVar10 = (long)(int)uVar2;
      pcVar11 = (this->fEqValues).super_TPZManVector<std::complex<double>,_1000>.
                super_TPZVec<std::complex<double>_>.fStore;
      dVar1 = *(double *)pcVar11[lVar10]._M_value;
      if ((((dVar1 == 0.0) && (!NAN(dVar1))) &&
          (dVar1 = *(double *)(pcVar11[lVar10]._M_value + 8), dVar1 == 0.0)) && (!NAN(dVar1))) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Diagonal Value = 0 >> Aborting on Index = ",0x2a);
        poVar7 = (ostream *)std::ostream::operator<<(&std::cout,uVar2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," Equation = ",0xc);
        plVar8 = (long *)std::ostream::operator<<(poVar7,(int)uVar15);
        std::ios::widen((char)*(undefined8 *)(*plVar8 + -0x18) + (char)plVar8);
        std::ostream::put((char)plVar8);
        std::ostream::flush();
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Frontal/tpzeqnarray.cpp"
                   ,0xa5);
      }
      if (uVar15 == this->fNumEq - 1) {
        iVar9 = (int)(this->fEqValues).super_TPZManVector<std::complex<double>,_1000>.
                     super_TPZVec<std::complex<double>_>.fNElements;
      }
      else {
        iVar9 = (this->fEqStart).super_TPZManVector<int,_100>.super_TPZVec<int>.fStore[uVar15 + 1];
      }
      if ((dec & ~ELUPivot) == ELU) {
        pcVar11 = (this->fEqValues).super_TPZManVector<std::complex<double>,_1000>.
                  super_TPZVec<std::complex<double>_>.fStore + lVar10;
        lVar16 = (long)(this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.fStore[lVar10]
        ;
        if (((lVar16 < 0) ||
            ((F->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow <= lVar16)) ||
           ((F->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol < 1)) {
          TPZFMatrix<std::complex<double>_>::Error
                    ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        pcVar3 = F->fElem;
        uVar17 = *(undefined8 *)(pcVar3[lVar16]._M_value + 8);
        uVar4 = __divdc3((int)*(undefined8 *)pcVar3[lVar16]._M_value,uVar17,
                         *(undefined8 *)pcVar11->_M_value,*(undefined8 *)(pcVar11->_M_value + 8));
        *(undefined8 *)pcVar3[lVar16]._M_value = uVar4;
        *(undefined8 *)(pcVar3[lVar16]._M_value + 8) = uVar17;
      }
      lVar16 = (long)(this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.fStore[lVar10];
      if (((lVar16 < 0) ||
          ((F->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow <= lVar16)) ||
         ((F->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<std::complex<double>_>::Error
                  ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      local_58 = *(double *)F->fElem[lVar16]._M_value;
      dStack_50 = *(double *)(F->fElem[lVar16]._M_value + 8);
      lVar10 = lVar10 + 1;
      if ((int)lVar10 < iVar9) {
        lVar16 = lVar10 * 0x10;
        iVar9 = ~uVar2 + iVar9;
        do {
          local_68 = local_58;
          dStack_60 = dStack_50;
          std::complex<double>::operator*=
                    ((complex<double> *)&local_68,
                     (complex<double> *)
                     (((this->fEqValues).super_TPZManVector<std::complex<double>,_1000>.
                       super_TPZVec<std::complex<double>_>.fStore)->_M_value + lVar16));
          lVar13 = (long)(this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.fStore
                         [lVar10];
          if (((lVar13 < 0) ||
              ((F->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow <= lVar13)) ||
             ((F->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<std::complex<double>_>::Error
                      ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          pcVar11 = F->fElem + lVar13;
          dVar1 = *(double *)(pcVar11->_M_value + 8) - dStack_60;
          auVar5._8_4_ = SUB84(dVar1,0);
          auVar5._0_8_ = *(double *)pcVar11->_M_value - local_68;
          auVar5._12_4_ = (int)((ulong)dVar1 >> 0x20);
          *(undefined1 (*) [16])F->fElem[lVar13]._M_value = auVar5;
          lVar10 = lVar10 + 1;
          lVar16 = lVar16 + 0x10;
          iVar9 = iVar9 + -1;
        } while (iVar9 != 0);
      }
      uVar15 = uVar15 + 2;
    } while ((int)uVar15 < this->fNumEq);
  }
  return;
}

Assistant:

void TPZEqnArray<TVar>::EqnForward(TPZFMatrix<TVar> & F, DecomposeType dec) {
	int j;
	if(IsSymmetric()==EIsSymmetric){
		
		for(j=0; j<fNumEq; j++) {
			int index = fEqStart[j];
			if(fEqValues[index] == (TVar)0.) {
				cout << "Diagonal Value = 0 >> Aborting on Index = " << index << " Equation = " << j << endl;
				DebugStop();
			}
			int last_term;
			if(j==fNumEq-1){
				last_term=fEqValues.NElements();
			}else last_term = fEqStart[j+1];
			
			/** cholesky e lu */
			if(dec==ECholesky || dec==ELU) {
				F(fIndex[index],0) /= fEqValues[index];
			}
			/** ldlt cholesky lu */
			TVar udiag = F(fIndex[index],0);
			
			int i;
			//+1 ou +2
			for(i = index + 1; i < last_term; i++) F(fIndex[i],0) -= udiag * fEqValues[i];
			/** finalizacao para ldlt */
			if(dec == ELDLt) F(fIndex[index],0) /= fEqValues[index];
		}
	} else if(IsSymmetric()==EIsNonSymmetric) {
		for(j=1; j<fNumEq; j+=2) {
			int index = fEqStart[j];
			
			if(fEqValues[index] == (TVar)0.){
				cout << "Diagonal Value = 0 >> Aborting on Index = " << index << " Equation = " << j << endl;
				DebugStop();
			}          
			
			int last_term;
			if(j==fNumEq-1){
				last_term=fEqValues.NElements();
			}else last_term = fEqStart[j+1];
			//if(fEqStart.NElements()
			
			
			/** cholesky e lu */
			if(dec==ECholesky || dec==ELU) {
				F(fIndex[index],0) /= fEqValues[index];
			}
			/** ldlt cholesky lu */
			TVar udiag = F(fIndex[index],0);
			
			
			int i;
			for(i = index + 1; i < last_term; i++) F(fIndex[i],0) -= udiag * fEqValues[i];
		}
	}
}